

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O1

LY_ERR lys_compile_unres_mod(lysc_ctx *ctx)

{
  uint uVar1;
  lys_module *plVar2;
  lyd_node *plVar3;
  lysc_node *plVar4;
  LY_ERR LVar5;
  char **ppcVar6;
  long *plVar7;
  ulong uVar8;
  char *pcVar9;
  
  if ((ctx->augs).count != 0) {
    plVar2 = ctx->cur_mod;
    uVar8 = 0;
    do {
      plVar3 = (ctx->augs).field_2.dnodes[uVar8];
      ctx->cur_mod = *(lys_module **)plVar3->schema;
      if (plVar3->next != (lyd_node *)0x0) {
        lysc_update_path(ctx,(lys_module *)0x0,"{extension}");
        lysc_update_path(ctx,(lys_module *)0x0,*(char **)plVar3->next);
      }
      lysc_update_path(ctx,(lys_module *)0x0,"{augment}");
      lysc_update_path(ctx,(lys_module *)0x0,(char *)**(undefined8 **)plVar3);
      pcVar9 = " extension";
      if (plVar3->next == (lyd_node *)0x0) {
        pcVar9 = "";
      }
      plVar4 = plVar3->schema;
      if (((ulong)plVar4[1].name & 0x200) == 0) {
        ppcVar6 = (char **)(*(long *)plVar4 + 8);
      }
      else {
        ppcVar6 = &plVar4[1].dsc;
      }
      ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,
              "Augment%s target node \"%s\" from module \"%s\" was not found.",pcVar9,
              **(undefined8 **)plVar3,*ppcVar6);
      ctx->cur_mod = plVar2;
      lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
      lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
      if (plVar3->next != (lyd_node *)0x0) {
        lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
        lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
      }
      uVar8 = uVar8 + 1;
      uVar1 = (ctx->augs).count;
    } while (uVar8 < uVar1);
    if (uVar1 != 0) {
      return LY_ENOTFOUND;
    }
  }
  if ((ctx->devs).count == 0) {
    LVar5 = LY_SUCCESS;
  }
  else {
    uVar8 = 0;
    do {
      plVar3 = (ctx->devs).field_2.dnodes[uVar8];
      lysc_update_path(ctx,(lys_module *)0x0,"{deviation}");
      lysc_update_path(ctx,(lys_module *)0x0,(char *)**(undefined8 **)plVar3);
      plVar7 = *(long **)&plVar3->parent->field_0;
      if ((*(byte *)((long)plVar7 + 0x79) & 2) == 0) {
        plVar7 = (long *)(*plVar7 + 8);
      }
      else {
        plVar7 = plVar7 + 0x10;
      }
      ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,
              "Deviation(s) target node \"%s\" from module \"%s\" was not found.",
              **(undefined8 **)plVar3,*plVar7);
      lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
      lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
      uVar8 = uVar8 + 1;
      uVar1 = (ctx->devs).count;
    } while (uVar8 < uVar1);
    LVar5 = (uint)(uVar1 != 0) * 5;
  }
  return LVar5;
}

Assistant:

static LY_ERR
lys_compile_unres_mod(struct lysc_ctx *ctx)
{
    struct lysc_augment *aug;
    struct lysc_deviation *dev;
    struct lys_module *orig_mod = ctx->cur_mod;
    uint32_t i;

    /* check that all augments were applied */
    for (i = 0; i < ctx->augs.count; ++i) {
        aug = ctx->augs.objs[i];
        ctx->cur_mod = aug->aug_pmod->mod;
        if (aug->ext) {
            lysc_update_path(ctx, NULL, "{extension}");
            lysc_update_path(ctx, NULL, aug->ext->name);
        }
        lysc_update_path(ctx, NULL, "{augment}");
        lysc_update_path(ctx, NULL, aug->nodeid->str);
        LOGVAL(ctx->ctx, LYVE_REFERENCE, "Augment%s target node \"%s\" from module \"%s\" was not found.",
                aug->ext ? " extension" : "", aug->nodeid->str, LYSP_MODULE_NAME(aug->aug_pmod));
        ctx->cur_mod = orig_mod;
        lysc_update_path(ctx, NULL, NULL);
        lysc_update_path(ctx, NULL, NULL);
        if (aug->ext) {
            lysc_update_path(ctx, NULL, NULL);
            lysc_update_path(ctx, NULL, NULL);
        }
    }
    if (ctx->augs.count) {
        return LY_ENOTFOUND;
    }

    /* check that all deviations were applied */
    for (i = 0; i < ctx->devs.count; ++i) {
        dev = ctx->devs.objs[i];
        lysc_update_path(ctx, NULL, "{deviation}");
        lysc_update_path(ctx, NULL, dev->nodeid->str);
        LOGVAL(ctx->ctx, LYVE_REFERENCE, "Deviation(s) target node \"%s\" from module \"%s\" was not found.",
                dev->nodeid->str, LYSP_MODULE_NAME(dev->dev_pmods[0]));
        lysc_update_path(ctx, NULL, NULL);
        lysc_update_path(ctx, NULL, NULL);
    }
    if (ctx->devs.count) {
        return LY_ENOTFOUND;
    }

    return LY_SUCCESS;
}